

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O2

int nn_ws_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  size_t __n;
  nn_ws_optset *optset;
  
  if (option == 1) {
    __n = 4;
    if (*optvallen < 4) {
      __n = *optvallen;
    }
    memcpy(optval,self + 1,__n);
    *optvallen = 4;
    return 0;
  }
  return -0x5c;
}

Assistant:

static int nn_ws_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ws_optset *optset;

    optset = nn_cont (self, struct nn_ws_optset, base);

    switch (option) {
    case NN_WS_MSG_TYPE:
        memcpy (optval, &optset->msg_type,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}